

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  long in_RSI;
  ConsoleReporter *in_RDI;
  ConsoleAssertionPrinter printer;
  bool includeResults;
  AssertionResult *result;
  byte local_d5;
  undefined1 in_stack_ffffffffffffff5f;
  AssertionStats *in_stack_ffffffffffffff60;
  ostream *in_stack_ffffffffffffff68;
  ConsoleAssertionPrinter *in_stack_ffffffffffffff70;
  
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x31ce41);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  local_d5 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk((AssertionResult *)in_RDI);
    local_d5 = bVar1 ^ 0xff;
  }
  if (((local_d5 & 1) == 0) &&
     (OVar3 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8)), OVar3 != Warning)) {
    return false;
  }
  lazyPrint(in_RDI);
  anon_unknown_1::ConsoleAssertionPrinter::ConsoleAssertionPrinter
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (bool)in_stack_ffffffffffffff5f);
  anon_unknown_1::ConsoleAssertionPrinter::print((ConsoleAssertionPrinter *)in_RDI);
  std::ostream::operator<<
            ((in_RDI->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
             std::endl<char,std::char_traits<char>>);
  anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)in_RDI);
  return true;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}